

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O2

int h264_mb_pred(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,h264_macroblock *mb)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint32_t uVar5;
  uint32_t *puVar6;
  uint32_t (*pauVar7) [4];
  int32_t (*paiVar8) [2];
  int32_t *piVar9;
  long lVar10;
  long lVar11;
  uint32_t uVar12;
  bool bVar13;
  int ifrom [4];
  int pmode [4];
  
  uVar1 = mb->mb_type;
  uVar4 = (ulong)uVar1;
  if (uVar4 < 0x1b) {
    if (uVar1 - 0x19 < 0xffffffe8) {
      if (mb->transform_size_8x8_flag == 0) {
        puVar6 = mb->prev_intra4x4_pred_mode_flag;
        lVar10 = 0x10;
        while (bVar13 = lVar10 != 0, lVar10 = lVar10 + -1, bVar13) {
          iVar2 = h264_prev_intra_pred_mode_flag(str,cabac,puVar6);
          if (iVar2 != 0) {
            return 1;
          }
          if ((*puVar6 == 0) &&
             (iVar2 = h264_rem_intra_pred_mode(str,cabac,puVar6 + 0x10), iVar2 != 0)) {
            return 1;
          }
          puVar6 = puVar6 + 1;
        }
      }
      else {
        puVar6 = mb->prev_intra8x8_pred_mode_flag;
        lVar10 = 4;
        while (bVar13 = lVar10 != 0, lVar10 = lVar10 + -1, bVar13) {
          iVar2 = h264_prev_intra_pred_mode_flag(str,cabac,puVar6);
          if (iVar2 != 0) {
            return 1;
          }
          if ((*puVar6 == 0) && (iVar2 = h264_rem_intra_pred_mode(str,cabac,puVar6 + 4), iVar2 != 0)
             ) {
            return 1;
          }
          puVar6 = puVar6 + 1;
        }
      }
    }
    if (slice->chroma_array_type - 1 < 2) {
      iVar2 = h264_intra_chroma_pred_mode(str,cabac,&mb->intra_chroma_pred_mode);
    }
    else {
      iVar2 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
    }
    if ((iVar2 != 0) || (iVar2 = infer_intra(str,mb,0), iVar2 != 0)) {
      return 1;
    }
  }
  else {
    if (uVar1 != 0x21) {
      ifrom[0] = -1;
      iVar2 = mb_part_info[uVar4][0];
      pmode[0] = mb_part_info[uVar4][1];
      if (iVar2 == 2) {
        ifrom[1] = -1;
        ifrom[2] = 0;
        ifrom[3] = 1;
        pmode[1] = mb_part_info[uVar4][2];
      }
      else if (iVar2 == 1) {
        ifrom[1] = 0;
        ifrom[2] = -1;
        ifrom[3] = 2;
        pmode[2] = mb_part_info[uVar4][2];
      }
      else if (iVar2 == 0) {
        ifrom[1] = 0;
        ifrom[2] = 0;
        ifrom[3] = 0;
      }
      uVar12 = slice->num_ref_idx_l0_active_minus1;
      if ((slice->mbaff_frame_flag != 0) && (mb->mb_field_decoding_flag != 0)) {
        uVar12 = uVar12 * 2 + 1;
      }
      pauVar7 = mb->ref_idx;
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        if ((long)ifrom[lVar10] == -1) {
          if ((*(byte *)(pmode + lVar10) & 1) == 0) {
            uVar5 = 0;
            goto LAB_00105b4a;
          }
          iVar2 = h264_ref_idx(str,cabac,(int)lVar10,0,uVar12,*pauVar7);
        }
        else {
          uVar5 = mb->ref_idx[0][ifrom[lVar10]];
LAB_00105b4a:
          iVar2 = vs_infer(str,*pauVar7,uVar5);
        }
        if (iVar2 != 0) {
          return 1;
        }
        pauVar7 = (uint32_t (*) [4])(*pauVar7 + 1);
      }
      uVar12 = slice->num_ref_idx_l1_active_minus1;
      if ((slice->mbaff_frame_flag != 0) && (mb->mb_field_decoding_flag != 0)) {
        uVar12 = uVar12 * 2 + 1;
      }
      pauVar7 = mb->ref_idx + 1;
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        if ((long)ifrom[lVar10] == -1) {
          if ((*(byte *)(pmode + lVar10) & 2) == 0) {
            uVar5 = 0;
            goto LAB_00105bda;
          }
          iVar2 = h264_ref_idx(str,cabac,(int)lVar10,1,uVar12,*pauVar7);
        }
        else {
          uVar5 = mb->ref_idx[1][ifrom[lVar10]];
LAB_00105bda:
          iVar2 = vs_infer(str,*pauVar7,uVar5);
        }
        if (iVar2 != 0) {
          return 1;
        }
        pauVar7 = (uint32_t (*) [4])(*pauVar7 + 1);
      }
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        lVar11 = (long)ifrom[lVar10];
        if (lVar11 == -1) {
          iVar2 = (int)lVar10 * 4;
          paiVar8 = mb->mvd[0] + lVar10 * 4;
          if ((*(byte *)(pmode + lVar10) & 1) == 0) {
            iVar2 = vs_infers(str,*paiVar8,0);
            if (iVar2 != 0) {
              return 1;
            }
            iVar2 = vs_infers(str,*paiVar8 + 1,0);
          }
          else {
            iVar3 = h264_mvd(str,cabac,iVar2,0,0,*paiVar8);
            if (iVar3 != 0) {
              return 1;
            }
            iVar2 = h264_mvd(str,cabac,iVar2,1,0,*paiVar8 + 1);
          }
        }
        else {
          paiVar8 = mb->mvd[0] + lVar10 * 4;
          iVar2 = vs_infers(str,*paiVar8,mb->mvd[0][lVar11 * 4][0]);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infers(str,*paiVar8 + 1,mb->mvd[0][lVar11 * 4][1]);
        }
        if (iVar2 != 0) {
          return 1;
        }
        lVar11 = 4;
        piVar9 = mb->mvd[0][lVar10 * 4 + 1] + 1;
        while (lVar11 = lVar11 + -1, lVar11 != 0) {
          iVar2 = vs_infers(str,(int32_t *)(piVar9 + -1),mb->mvd[0][lVar10 * 4][0]);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infers(str,piVar9,mb->mvd[0][lVar10 * 4][1]);
          piVar9 = piVar9 + 2;
          if (iVar2 != 0) {
            return 1;
          }
        }
      }
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        lVar11 = (long)ifrom[lVar10];
        if (lVar11 == -1) {
          iVar2 = (int)lVar10 * 4;
          paiVar8 = mb->mvd[1] + lVar10 * 4;
          if ((*(byte *)(pmode + lVar10) & 2) == 0) {
            iVar2 = vs_infers(str,*paiVar8,0);
            if (iVar2 != 0) {
              return 1;
            }
            iVar2 = vs_infers(str,*paiVar8 + 1,0);
          }
          else {
            iVar3 = h264_mvd(str,cabac,iVar2,0,1,*paiVar8);
            if (iVar3 != 0) {
              return 1;
            }
            iVar2 = h264_mvd(str,cabac,iVar2,1,1,*paiVar8 + 1);
          }
        }
        else {
          paiVar8 = mb->mvd[1] + lVar10 * 4;
          iVar2 = vs_infers(str,*paiVar8,mb->mvd[1][lVar11 * 4][0]);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infers(str,*paiVar8 + 1,
                            (*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))[lVar11 * 4][1]);
        }
        if (iVar2 != 0) {
          return 1;
        }
        lVar11 = 4;
        piVar9 = (*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))[lVar10 * 4 + 1] + 1;
        while (lVar11 = lVar11 + -1, lVar11 != 0) {
          iVar2 = vs_infers(str,(int32_t *)(piVar9 + -1),mb->mvd[1][lVar10 * 4][0]);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infers(str,piVar9,
                            (*(int32_t (*) [16] [2])(mb->block_luma_dc + -2))[lVar10 * 4][1]);
          piVar9 = piVar9 + 2;
          if (iVar2 != 0) {
            return 1;
          }
        }
      }
      iVar2 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
      goto LAB_00105aa5;
    }
    iVar2 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = infer_intra(str,mb,0);
    if (iVar2 != 0) {
      return 1;
    }
  }
  iVar2 = infer_intra(str,mb,1);
LAB_00105aa5:
  return (uint)(iVar2 != 0);
}

Assistant:

int h264_mb_pred(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb) {
	int i, j;
	if (mb->mb_type < H264_MB_TYPE_P_BASE) {
		if (!h264_is_intra_16x16_mb_type(mb->mb_type)) {
			if (!mb->transform_size_8x8_flag) {
				for (i = 0; i < 16; i++) {
					if (h264_prev_intra_pred_mode_flag(str, cabac, &mb->prev_intra4x4_pred_mode_flag[i])) return 1;
					if (!mb->prev_intra4x4_pred_mode_flag[i])
						if (h264_rem_intra_pred_mode(str, cabac, &mb->rem_intra4x4_pred_mode[i])) return 1;
				}
			} else {
				for (i = 0; i < 4; i++) {
					if (h264_prev_intra_pred_mode_flag(str, cabac, &mb->prev_intra8x8_pred_mode_flag[i])) return 1;
					if (!mb->prev_intra8x8_pred_mode_flag[i])
						if (h264_rem_intra_pred_mode(str, cabac, &mb->rem_intra8x8_pred_mode[i])) return 1;
				}
			}
		}
		if (slice->chroma_array_type == 1 || slice->chroma_array_type == 2) {
			if (h264_intra_chroma_pred_mode(str, cabac, &mb->intra_chroma_pred_mode)) return 1;
		} else {
			if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		}
		if (infer_intra(str, mb, 0)) return 1;
		if (infer_intra(str, mb, 1)) return 1;
	} else if (mb->mb_type != H264_MB_TYPE_B_DIRECT_16X16) {
		int ifrom[4], pmode[4];
		ifrom[0] = -1;
		pmode[0] = mb_part_info[mb->mb_type][1];
		switch (mb_part_info[mb->mb_type][0]) {
			case 0: /* 16x16 */
				ifrom[1] = 0;
				ifrom[2] = 0;
				ifrom[3] = 0;
				break;
			case 1: /* 16x8 */
				ifrom[1] = 0;
				ifrom[2] = -1;
				ifrom[3] = 2;
				pmode[2] = mb_part_info[mb->mb_type][2];
				break;
			case 2:
				ifrom[1] = -1;
				ifrom[2] = 0;
				ifrom[3] = 1;
				pmode[1] = mb_part_info[mb->mb_type][2];
				break;
		}
		int max = slice->num_ref_idx_l0_active_minus1;
		if (slice->mbaff_frame_flag && mb->mb_field_decoding_flag)
			max *= 2, max++;
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 1) {
					if (h264_ref_idx(str, cabac, i, 0, max, &mb->ref_idx[0][i])) return 1;
				} else {
					if (vs_infer(str, &mb->ref_idx[0][i], 0)) return 1;
				}
			} else {
				if (vs_infer(str, &mb->ref_idx[0][i], mb->ref_idx[0][ifrom[i]])) return 1;
			}
		}
		max = slice->num_ref_idx_l1_active_minus1;
		if (slice->mbaff_frame_flag && mb->mb_field_decoding_flag)
			max *= 2, max++;
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 2) {
					if (h264_ref_idx(str, cabac, i, 1, max, &mb->ref_idx[1][i])) return 1;
				} else {
					if (vs_infer(str, &mb->ref_idx[1][i], 0)) return 1;
				}
			} else {
				if (vs_infer(str, &mb->ref_idx[1][i], mb->ref_idx[1][ifrom[i]])) return 1;
			}
		}
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 1) {
					if (h264_mvd(str, cabac, i * 4, 0, 0, &mb->mvd[0][i*4][0])) return 1;
					if (h264_mvd(str, cabac, i * 4, 1, 0, &mb->mvd[0][i*4][1])) return 1;
				} else {
					if (vs_infers(str, &mb->mvd[0][i*4][0], 0)) return 1;
					if (vs_infers(str, &mb->mvd[0][i*4][1], 0)) return 1;
				}
			} else {
				if (vs_infers(str, &mb->mvd[0][i*4][0], mb->mvd[0][ifrom[i]*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[0][i*4][1], mb->mvd[0][ifrom[i]*4][1])) return 1;
			}
			for (j = 1; j < 4; j++) {
				if (vs_infers(str, &mb->mvd[0][i*4+j][0], mb->mvd[0][i*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[0][i*4+j][1], mb->mvd[0][i*4][1])) return 1;
			}
		}
		for (i = 0; i < 4; i++) {
			if (ifrom[i] == -1) {
				if (pmode[i] & 2) {
					if (h264_mvd(str, cabac, i * 4, 0, 1, &mb->mvd[1][i*4][0])) return 1;
					if (h264_mvd(str, cabac, i * 4, 1, 1, &mb->mvd[1][i*4][1])) return 1;
				} else {
					if (vs_infers(str, &mb->mvd[1][i*4][0], 0)) return 1;
					if (vs_infers(str, &mb->mvd[1][i*4][1], 0)) return 1;
				}
			} else {
				if (vs_infers(str, &mb->mvd[1][i*4][0], mb->mvd[1][ifrom[i]*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[1][i*4][1], mb->mvd[1][ifrom[i]*4][1])) return 1;
			}
			for (j = 1; j < 4; j++) {
				if (vs_infers(str, &mb->mvd[1][i*4+j][0], mb->mvd[1][i*4][0])) return 1;
				if (vs_infers(str, &mb->mvd[1][i*4+j][1], mb->mvd[1][i*4][1])) return 1;
			}
		}
		if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
	} else {
		if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		if (infer_intra(str, mb, 0)) return 1;
		if (infer_intra(str, mb, 1)) return 1;
	}
	return 0;
}